

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O3

bool __thiscall
Assimp::glTFImporter::CanRead(glTFImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  bool bVar2;
  string version;
  Asset asset;
  string local_7d8;
  char *local_7b8;
  long local_7b0;
  char local_7a8 [16];
  Asset local_798;
  
  BaseImporter::GetExtension(&local_7d8,pFile);
  iVar1 = std::__cxx11::string::compare((char *)&local_7d8);
  if (iVar1 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      bVar2 = false;
      goto LAB_006395fd;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_7d8);
    bVar2 = false;
    if ((pIOHandler == (IOSystem *)0x0) || (iVar1 != 0)) goto LAB_006395fd;
  }
  glTF::Asset::Asset(&local_798,pIOHandler);
  iVar1 = std::__cxx11::string::compare((char *)&local_7d8);
  glTF::Asset::Load(&local_798,pFile,iVar1 == 0);
  local_7b8 = local_7a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b8,local_798.asset.version._M_dataplus._M_p,
             local_798.asset.version._M_dataplus._M_p + local_798.asset.version._M_string_length);
  if (local_7b0 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = *local_7b8 == '1';
  }
  if (local_7b8 != local_7a8) {
    operator_delete(local_7b8);
  }
  glTF::Asset::~Asset(&local_798);
LAB_006395fd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool glTFImporter::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const {
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb") {
        return false;
    }

    if (pIOHandler) {
        glTF::Asset asset(pIOHandler);
        try {
            asset.Load(pFile, extension == "glb");
            std::string version = asset.asset.version;
            return !version.empty() && version[0] == '1';
        } catch (...) {
            return false;
        }
    }

    return false;
}